

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::RegisterCommand::RegisterCommand(RegisterCommand *this,string_view module_name,Var *var)

{
  Var *var_local;
  RegisterCommand *this_local;
  string_view module_name_local;
  
  module_name_local.data_ = (char *)module_name.size_;
  this_local = (RegisterCommand *)module_name.data_;
  CommandMixin<(wabt::CommandType)2>::CommandMixin(&this->super_CommandMixin<(wabt::CommandType)2>);
  (this->super_CommandMixin<(wabt::CommandType)2>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_01e56040;
  string_view::operator_cast_to_string(&this->module_name,(string_view *)&this_local);
  Var::Var(&this->var,var);
  return;
}

Assistant:

RegisterCommand(string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}